

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArraySamplingTest::logLinkingLog
          (TextureCubeMapArraySamplingTest *this,programDefinition *info)

{
  ostringstream *this_00;
  string info_log;
  string local_1b0;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  if (info->m_program_object_id != 0) {
    TestCaseBase::getLinkingInfoLog_abi_cxx11_
              (&local_1b0,&this->super_TestCaseBase,info->m_program_object_id);
    local_190._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Program linking failure:\n\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

glw::GLuint TextureCubeMapArraySamplingTest::programDefinition::getProgramId() const
{
	return m_program_object_id;
}